

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

BOOL __thiscall
Js::TypedArray<unsigned_short,_false,_false>::BaseTypedDirectSetItem
          (TypedArray<unsigned_short,_false,_false> *this,uint32 index,Var value,
          _func_unsigned_short_Var_ScriptContext_ptr *convFunc)

{
  code *pcVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint32 uVar4;
  uint uVar5;
  ScriptContext *pSVar6;
  undefined4 *puVar7;
  ArrayBufferBase *pAVar8;
  unsigned_short *typedBuffer;
  unsigned_short typedValue;
  _func_unsigned_short_Var_ScriptContext_ptr *convFunc_local;
  Var value_local;
  uint32 index_local;
  TypedArray<unsigned_short,_false,_false> *this_local;
  
  pSVar6 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  uVar3 = (*convFunc)(value,pSVar6);
  bVar2 = Js::TypedArrayBase::IsDetachedBuffer(&this->super_TypedArrayBase);
  if (bVar2) {
    pSVar6 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowTypeError(pSVar6,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  uVar4 = ArrayObject::GetLength((ArrayObject *)this);
  if (index < uVar4) {
    uVar4 = ArrayObject::GetLength((ArrayObject *)this);
    if (uVar4 <= index) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                  ,0x1c9,"(index < GetLength())",
                                  "Trying to set out of bound index for typed array.");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    uVar4 = Js::TypedArrayBase::GetByteOffset(&this->super_TypedArrayBase);
    pAVar8 = ArrayBufferParent::GetArrayBuffer((ArrayBufferParent *)this);
    uVar5 = (*(pAVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar5 < (ulong)(index + 1) * 2 + (ulong)uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                  ,0x1ca,
                                  "((index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    *(unsigned_short *)((this->super_TypedArrayBase).buffer + (ulong)index * 2) = uVar3;
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

inline BOOL BaseTypedDirectSetItem(__in uint32 index, __in Js::Var value, TypeName (*convFunc)(Var value, ScriptContext* scriptContext))
        {
            // This call can potentially invoke user code, and may end up detaching the underlying array (this).
            // Therefore it was brought out and above the IsDetached check
            TypeName typedValue = convFunc(value, GetScriptContext());

            if (this->IsDetachedBuffer()) // 9.4.5.9 IntegerIndexedElementSet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            if (index >= GetLength())
            {
                return FALSE;
            }

            AssertMsg(index < GetLength(), "Trying to set out of bound index for typed array.");
            Assert((index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            TypeName* typedBuffer = (TypeName*)buffer;

            typedBuffer[index] = typedValue;

            return TRUE;
        }